

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_clear(nk_context *ctx)

{
  long lVar1;
  nk_context *in_RDI;
  nk_table *it;
  nk_table *n;
  nk_window *next;
  nk_window *iter;
  nk_table *tbl;
  nk_table *ptr;
  nk_context *in_stack_ffffffffffffffe8;
  nk_context *ctx_00;
  
  if (in_RDI != (nk_context *)0x0) {
    if (in_RDI->use_pool == 0) {
      nk_buffer_reset(&in_RDI->memory,NK_BUFFER_FRONT);
    }
    else {
      nk_buffer_clear(&in_RDI->memory);
    }
    in_RDI->build = 0;
    (in_RDI->memory).calls = 0;
    in_RDI->last_widget_state = 0;
    (in_RDI->style).cursor_active = (in_RDI->style).cursors[0];
    nk_memset(&in_RDI->overlay,0,0x40);
    ctx_00 = (nk_context *)in_RDI->begin;
    while (ctx_00 != (nk_context *)0x0) {
      if (((ctx_00->input).keyboard.keys[9].down & 0x4000U) == 0) {
        lVar1._0_4_ = (ctx_00->input).mouse.buttons[1].clicked;
        lVar1._4_4_ = (ctx_00->input).mouse.buttons[1].clicked_pos.x;
        if ((lVar1 != 0) && (**(uint **)&(ctx_00->input).mouse.buttons[1].clicked != in_RDI->seq)) {
          nk_free_window((nk_context *)it,(nk_window *)in_RDI);
          (ctx_00->input).mouse.buttons[1].clicked = 0;
          (ctx_00->input).mouse.buttons[1].clicked_pos.x = 0.0;
        }
        ptr = (nk_table *)(ctx_00->style).cursors[4];
        while (tbl = ptr, tbl != (nk_table *)0x0) {
          ptr = tbl->next;
          if (tbl->seq != in_RDI->seq) {
            nk_remove_table((nk_window *)ctx_00,tbl);
            nk_zero(ptr,(nk_size)tbl);
            nk_free_table(ctx_00,(nk_table *)in_stack_ffffffffffffffe8);
            if (tbl == (nk_table *)(ctx_00->style).cursors[4]) {
              (ctx_00->style).cursors[4] = (nk_cursor *)ptr;
            }
          }
        }
        if (((ctx_00->input).keyboard.keys[0].down == in_RDI->seq) &&
           (((ctx_00->input).keyboard.keys[9].down & 0x2000U) == 0)) {
          ctx_00 = (nk_context *)(ctx_00->style).cursors[6];
        }
        else {
          in_stack_ffffffffffffffe8 = (nk_context *)(ctx_00->style).cursors[6];
          nk_remove_window(in_RDI,(nk_window *)ctx_00);
          nk_free_window((nk_context *)it,(nk_window *)in_RDI);
          ctx_00 = in_stack_ffffffffffffffe8;
        }
      }
      else {
        ctx_00 = (nk_context *)(ctx_00->style).cursors[6];
      }
    }
    in_RDI->seq = in_RDI->seq + 1;
  }
  return;
}

Assistant:

NK_API void
nk_clear(struct nk_context *ctx)
{
    struct nk_window *iter;
    struct nk_window *next;
    NK_ASSERT(ctx);

    if (!ctx) return;
    if (ctx->use_pool)
        nk_buffer_clear(&ctx->memory);
    else nk_buffer_reset(&ctx->memory, NK_BUFFER_FRONT);

    ctx->build = 0;
    ctx->memory.calls = 0;
    ctx->last_widget_state = 0;
    ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_ARROW];
    NK_MEMSET(&ctx->overlay, 0, sizeof(ctx->overlay));
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_clear(&ctx->draw_list);
#endif

    /* garbage collector */
    iter = ctx->begin;
    while (iter) {
        /* make sure minimized windows do not get removed */
        if (iter->flags & NK_WINDOW_MINIMIZED) {
            iter = iter->next;
            continue;
        }

        /* free unused popup windows */
        if (iter->popup.win && iter->popup.win->seq != ctx->seq) {
            nk_free_window(ctx, iter->popup.win);
            iter->popup.win = 0;
        }

        /* remove unused window state tables */
        {struct nk_table *n, *it = iter->tables;
        while (it) {
            n = it->next;
            if (it->seq != ctx->seq) {
                nk_remove_table(iter, it);
                nk_zero(it, sizeof(union nk_page_data));
                nk_free_table(ctx, it);
                if (it == iter->tables)
                    iter->tables = n;
            }
            it = n;
        }}

        /* window itself is not used anymore so free */
        if (iter->seq != ctx->seq || iter->flags & NK_WINDOW_CLOSED) {
            next = iter->next;
            nk_remove_window(ctx, iter);
            nk_free_window(ctx, iter);
            iter = next;
        } else iter = iter->next;
    }
    ctx->seq++;
}